

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O1

TPM_RC TPMA_CC_Unmarshal(TPMA_CC *target,BYTE **buffer,INT32 *size)

{
  int iVar1;
  TPMA_CC TVar2;
  TPM_RC TVar3;
  
  iVar1 = *size;
  *size = iVar1 + -4;
  TVar3 = 0x9a;
  if (3 < iVar1) {
    TVar2 = (TPMA_CC)ByteArrayToUint32(*buffer);
    *target = TVar2;
    *buffer = *buffer + 4;
    TVar3 = 0xa1;
    if ((*(ushort *)&target->field_0x2 & 0xc03f) == 0) {
      TVar3 = *(ushort *)&target->field_0x2 & 0xc03f;
    }
  }
  return TVar3;
}

Assistant:

TPM_RC
TPMA_CC_Unmarshal(TPMA_CC *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = TPM_CC_Unmarshal((TPM_CC *)target, buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    if(*((UINT32 *)target) & (UINT32)0xc03f0000)
        return TPM_RC_RESERVED_BITS;
    return TPM_RC_SUCCESS;
}